

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::optimizeAll
          (pfederc *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr,
          size_t *reducedexpressions)

{
  tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool> local_48;
  pfederc local_38 [8];
  long *local_30;
  
  optimize((pfederc *)&local_48,expr,reducedexpressions);
  while (local_48.
         super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
         .super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl == true) {
    optimize(local_38,&local_48.
                       super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
                       .
                       super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
                       ._M_head_impl,reducedexpressions);
    std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>::operator=
              (&local_48,(type)local_38);
    if (local_30 != (long *)0x0) {
      (**(code **)(*local_30 + 8))();
    }
  }
  *(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this =
       local_48.
       super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
       .
       super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
       ._M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> pfederc::optimizeAll(std::unique_ptr<Expr> &&expr,
    size_t &reducedexpressions) noexcept {
  auto tpl = optimize(std::move(expr), reducedexpressions);
  while (std::get<1>(tpl)) {
    tpl = optimize(std::move(std::move(std::get<0>(tpl))), reducedexpressions);
  }

  return std::move(std::get<0>(tpl));
}